

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

int __thiscall Fl_RGB_Image::copy(Fl_RGB_Image *this,int W,int H)

{
  uchar *__src;
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_RGB_Scaling FVar6;
  int iVar7;
  int iVar8;
  uchar *puVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float local_1e4;
  float local_1dc;
  int local_1a0;
  float downf;
  float upf;
  float rightf;
  float leftf;
  int i;
  uchar downright [4];
  uchar downleft [4];
  uchar right [4];
  uchar left [4];
  uint drighty;
  uint drightx;
  uint dlefty;
  uint dleftx;
  uint righty;
  uint rightx;
  uint lefty;
  uint leftx;
  float xfract;
  float oldx;
  float yfract;
  float oldy;
  float yscale;
  float xscale;
  int ystep;
  int xstep;
  int ymod;
  int xmod;
  int yerr;
  int xerr;
  int sy;
  int c;
  int line_d;
  int dy;
  int dx;
  uchar *old_ptr;
  uchar *new_ptr;
  int wld;
  int wd;
  int dh;
  int dy_1;
  uchar *dst;
  uchar *src;
  uchar *new_array;
  Fl_RGB_Image *new_image;
  int H_local;
  int W_local;
  Fl_RGB_Image *this_local;
  
  iVar2 = Fl_Image::w(&this->super_Fl_Image);
  if (((((W != iVar2) || (iVar2 = Fl_Image::h(&this->super_Fl_Image), H != iVar2)) &&
       (iVar2 = Fl_Image::w(&this->super_Fl_Image), iVar2 != 0)) &&
      ((iVar2 = Fl_Image::h(&this->super_Fl_Image), iVar2 != 0 &&
       (iVar2 = Fl_Image::d(&this->super_Fl_Image), iVar2 != 0)))) && (this->array != (uchar *)0x0))
  {
    if ((W < 1) || (H < 1)) {
      this_local = (Fl_RGB_Image *)0x0;
    }
    else {
      iVar2 = Fl_Image::d(&this->super_Fl_Image);
      old_ptr = (uchar *)operator_new__((long)(W * H * iVar2));
      this_local = (Fl_RGB_Image *)operator_new(0x40);
      iVar2 = Fl_Image::d(&this->super_Fl_Image);
      Fl_RGB_Image(this_local,old_ptr,W,H,iVar2,0);
      this_local->alloc_array = 1;
      iVar2 = Fl_Image::ld(&this->super_Fl_Image);
      if (iVar2 == 0) {
        local_1a0 = Fl_Image::w(&this->super_Fl_Image);
        iVar2 = Fl_Image::d(&this->super_Fl_Image);
        local_1a0 = local_1a0 * iVar2;
      }
      else {
        local_1a0 = Fl_Image::ld(&this->super_Fl_Image);
      }
      FVar6 = Fl_Image::RGB_scaling();
      if (FVar6 == FL_RGB_SCALING_NEAREST) {
        iVar2 = Fl_Image::w(&this->super_Fl_Image);
        iVar3 = Fl_Image::w(&this->super_Fl_Image);
        iVar4 = Fl_Image::d(&this->super_Fl_Image);
        iVar5 = Fl_Image::h(&this->super_Fl_Image);
        iVar7 = Fl_Image::h(&this->super_Fl_Image);
        yerr = 0;
        ymod = H;
        for (c = H; 0 < c; c = c + -1) {
          _dy = this->array + yerr * local_1a0;
          xmod = W;
          for (line_d = W; 0 < line_d; line_d = line_d + -1) {
            for (xerr = 0; iVar8 = Fl_Image::d(&this->super_Fl_Image), xerr < iVar8; xerr = xerr + 1
                ) {
              *old_ptr = _dy[xerr];
              old_ptr = old_ptr + 1;
            }
            _dy = _dy + (iVar3 / W) * iVar4;
            xmod = xmod - iVar2 % W;
            if (xmod < 1) {
              xmod = W + xmod;
              iVar8 = Fl_Image::d(&this->super_Fl_Image);
              _dy = _dy + iVar8;
            }
          }
          yerr = iVar7 / H + yerr;
          ymod = ymod - iVar5 % H;
          if (ymod < 1) {
            ymod = H + ymod;
            yerr = yerr + 1;
          }
        }
      }
      else {
        iVar2 = Fl_Image::w(&this->super_Fl_Image);
        iVar3 = Fl_Image::h(&this->super_Fl_Image);
        for (c = 0; c < H; c = c + 1) {
          oldx = (float)c * ((float)(iVar3 + -1) / (float)H);
          iVar4 = Fl_Image::h(&this->super_Fl_Image);
          if ((float)iVar4 <= oldx) {
            iVar4 = Fl_Image::h(&this->super_Fl_Image);
            oldx = (float)(iVar4 + -1);
          }
          fVar11 = oldx - (float)((long)oldx & 0xffffffff);
          for (line_d = 0; line_d < W; line_d = line_d + 1) {
            iVar4 = Fl_Image::d(&this->super_Fl_Image);
            iVar5 = Fl_Image::d(&this->super_Fl_Image);
            lVar1 = (long)(line_d * iVar5) + (long)(c * W * iVar4);
            leftx = (uint)((float)line_d * ((float)(iVar2 + -1) / (float)W));
            iVar4 = Fl_Image::w(&this->super_Fl_Image);
            if ((float)iVar4 <= (float)leftx) {
              iVar4 = Fl_Image::w(&this->super_Fl_Image);
              leftx = (uint)(float)(iVar4 + -1);
            }
            fVar12 = (float)leftx - (float)((long)(float)leftx & 0xffffffff);
            iVar4 = Fl_Image::w(&this->super_Fl_Image);
            if ((float)leftx + 1.0 < (float)iVar4) {
              local_1dc = (float)leftx + 1.0;
            }
            else {
              local_1dc = (float)leftx;
            }
            iVar4 = Fl_Image::h(&this->super_Fl_Image);
            if (oldx + 1.0 < (float)iVar4) {
              local_1e4 = oldx + 1.0;
            }
            else {
              local_1e4 = oldx;
            }
            puVar9 = this->array;
            iVar4 = Fl_Image::d(&this->super_Fl_Image);
            iVar5 = Fl_Image::d(&this->super_Fl_Image);
            memcpy(downleft,puVar9 + (ulong)(uint)((int)(long)(float)leftx * iVar4) +
                                     (ulong)(uint)((int)(long)oldx * local_1a0),(long)iVar5);
            puVar9 = this->array;
            iVar4 = Fl_Image::d(&this->super_Fl_Image);
            iVar5 = Fl_Image::d(&this->super_Fl_Image);
            memcpy(downright,
                   puVar9 + (ulong)(uint)((int)(long)local_1dc * iVar4) +
                            (ulong)(uint)((int)(long)oldx * local_1a0),(long)iVar5);
            puVar9 = this->array;
            iVar4 = Fl_Image::d(&this->super_Fl_Image);
            iVar5 = Fl_Image::d(&this->super_Fl_Image);
            memcpy(&i,puVar9 + (ulong)(uint)((int)(long)(float)leftx * iVar4) +
                               (ulong)(uint)((int)(long)local_1e4 * local_1a0),(long)iVar5);
            puVar9 = this->array;
            iVar4 = Fl_Image::d(&this->super_Fl_Image);
            iVar5 = Fl_Image::d(&this->super_Fl_Image);
            memcpy(&leftf,puVar9 + (ulong)(uint)((int)(long)local_1dc * iVar4) +
                                   (ulong)(uint)((int)(long)local_1e4 * local_1a0),(long)iVar5);
            iVar4 = Fl_Image::d(&this->super_Fl_Image);
            if (iVar4 == 4) {
              for (rightf = 0.0; (int)rightf < 3; rightf = (float)((int)rightf + 1)) {
                downleft[(int)rightf] =
                     (uchar)(int)((float)((uint)downleft[(int)rightf] * (uint)downleft[3]) / 255.0);
                downright[(int)rightf] =
                     (uchar)(int)((float)((uint)downright[(int)rightf] * (uint)downright[3]) / 255.0
                                 );
                downright[(long)(int)rightf + -4] =
                     (uchar)(int)((float)((uint)downright[(long)(int)rightf + -4] * (uint)i._3_1_) /
                                 255.0);
                *(char *)((long)&leftf + (long)(int)rightf) =
                     (char)(int)((float)((uint)*(byte *)((long)&leftf + (long)(int)rightf) *
                                        (uint)leftf._3_1_) / 255.0);
              }
            }
            for (rightf = 0.0; iVar4 = Fl_Image::d(&this->super_Fl_Image), (int)rightf < iVar4;
                rightf = (float)((int)rightf + 1)) {
              lVar10 = (long)(int)rightf;
              old_ptr[(int)rightf + lVar1] =
                   (uchar)(int)(((float)downleft[lVar10] * (1.0 - fVar12) +
                                (float)downright[lVar10] * fVar12) * (1.0 - fVar11) +
                               ((float)downright[lVar10 + -4] * (1.0 - fVar12) +
                               (float)*(byte *)((long)&leftf + lVar10) * fVar12) * fVar11);
            }
            iVar4 = Fl_Image::d(&this->super_Fl_Image);
            if ((iVar4 == 4) && (old_ptr[lVar1 + 3] != '\0')) {
              for (rightf = 0.0; (int)rightf < 3; rightf = (float)((int)rightf + 1)) {
                old_ptr[(int)rightf + lVar1] =
                     (uchar)(int)((float)old_ptr[(int)rightf + lVar1] /
                                 ((float)old_ptr[lVar1 + 3] / 255.0));
              }
            }
          }
        }
      }
    }
    goto LAB_001f3be4;
  }
  if (this->array == (uchar *)0x0) {
    this_local = (Fl_RGB_Image *)operator_new(0x40);
    puVar9 = this->array;
    iVar2 = Fl_Image::w(&this->super_Fl_Image);
    iVar3 = Fl_Image::h(&this->super_Fl_Image);
    iVar4 = Fl_Image::d(&this->super_Fl_Image);
    iVar5 = Fl_Image::ld(&this->super_Fl_Image);
    Fl_RGB_Image(this_local,puVar9,iVar2,iVar3,iVar4,iVar5);
    goto LAB_001f3be4;
  }
  iVar2 = Fl_Image::w(&this->super_Fl_Image);
  iVar3 = Fl_Image::h(&this->super_Fl_Image);
  iVar4 = Fl_Image::d(&this->super_Fl_Image);
  puVar9 = (uchar *)operator_new__((long)(iVar2 * iVar3 * iVar4));
  iVar2 = Fl_Image::ld(&this->super_Fl_Image);
  if (iVar2 == 0) {
LAB_001f2ecb:
    __src = this->array;
    iVar2 = Fl_Image::w(&this->super_Fl_Image);
    iVar3 = Fl_Image::h(&this->super_Fl_Image);
    iVar4 = Fl_Image::d(&this->super_Fl_Image);
    memcpy(puVar9,__src,(long)(iVar2 * iVar3 * iVar4));
  }
  else {
    iVar2 = Fl_Image::ld(&this->super_Fl_Image);
    iVar3 = Fl_Image::w(&this->super_Fl_Image);
    iVar4 = Fl_Image::d(&this->super_Fl_Image);
    if (iVar2 == iVar3 * iVar4) goto LAB_001f2ecb;
    dst = this->array;
    iVar2 = Fl_Image::h(&this->super_Fl_Image);
    iVar3 = Fl_Image::w(&this->super_Fl_Image);
    iVar4 = Fl_Image::d(&this->super_Fl_Image);
    iVar5 = Fl_Image::ld(&this->super_Fl_Image);
    _dh = puVar9;
    for (wd = 0; wd < iVar2; wd = wd + 1) {
      memcpy(_dh,dst,(long)(iVar3 * iVar4));
      dst = dst + iVar5;
      _dh = _dh + iVar3 * iVar4;
    }
  }
  this_local = (Fl_RGB_Image *)operator_new(0x40);
  iVar2 = Fl_Image::w(&this->super_Fl_Image);
  iVar3 = Fl_Image::h(&this->super_Fl_Image);
  iVar4 = Fl_Image::d(&this->super_Fl_Image);
  Fl_RGB_Image(this_local,puVar9,iVar2,iVar3,iVar4,0);
  this_local->alloc_array = 1;
LAB_001f3be4:
  return (int)this_local;
}

Assistant:

Fl_Image *Fl_RGB_Image::copy(int W, int H) {
  Fl_RGB_Image	*new_image;	// New RGB image
  uchar		*new_array;	// New array for image data

  // Optimize the simple copy where the width and height are the same,
  // or when we are copying an empty image...
  if ((W == w() && H == h()) ||
      !w() || !h() || !d() || !array) {
    if (array) {
      // Make a copy of the image data and return a new Fl_RGB_Image...
      new_array = new uchar[w() * h() * d()];
      if (ld() && ld()!=w()*d()) {
        const uchar *src = array;
        uchar *dst = new_array;
        int dy, dh = h(), wd = w()*d(), wld = ld();
        for (dy=0; dy<dh; dy++) {
          memcpy(dst, src, wd);
          src += wld;
          dst += wd;
        }
      } else {
        memcpy(new_array, array, w() * h() * d());
      }
      new_image = new Fl_RGB_Image(new_array, w(), h(), d());
      new_image->alloc_array = 1;

      return new_image;
    } else {
      return new Fl_RGB_Image(array, w(), h(), d(), ld());
    }
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and create new image
  uchar		*new_ptr;	// Pointer into new array
  const uchar	*old_ptr;	// Pointer into old array
  int		dx, dy,		// Destination coordinates
		line_d;		// stride from line to line

  // Allocate memory for the new image...
  new_array = new uchar [W * H * d()];
  new_image = new Fl_RGB_Image(new_array, W, H, d());
  new_image->alloc_array = 1;

  line_d = ld() ? ld() : w() * d();

  if (Fl_Image::RGB_scaling() == FL_RGB_SCALING_NEAREST) {

    int		c,		// Channel number
		sy,		// Source coordinate
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments

    // Figure out Bresenham step/modulus values...
    xmod   = w() % W;
    xstep  = (w() / W) * d();
    ymod   = h() % H;
    ystep  = h() / H;

    // Scale the image using a nearest-neighbor algorithm...
    for (dy = H, sy = 0, yerr = H, new_ptr = new_array; dy > 0; dy --) {
      for (dx = W, xerr = W, old_ptr = array + sy * line_d; dx > 0; dx --) {
        for (c = 0; c < d(); c ++) *new_ptr++ = old_ptr[c];

        old_ptr += xstep;
        xerr    -= xmod;

        if (xerr <= 0) {
          xerr    += W;
	  old_ptr += d();
        }
      }

      sy   += ystep;
      yerr -= ymod;
      if (yerr <= 0) {
        yerr += H;
        sy ++;
      }
    }
  } else {
    // Bilinear scaling (FL_RGB_SCALING_BILINEAR)
    const float xscale = (w() - 1) / (float) W;
    const float yscale = (h() - 1) / (float) H;
    for (dy = 0; dy < H; dy++) {
      float oldy = dy * yscale;
      if (oldy >= h())
        oldy = float(h() - 1);
      const float yfract = oldy - (unsigned) oldy;

      for (dx = 0; dx < W; dx++) {
        new_ptr = new_array + dy * W * d() + dx * d();

        float oldx = dx * xscale;
        if (oldx >= w())
          oldx = float(w() - 1);
        const float xfract = oldx - (unsigned) oldx;

        const unsigned leftx = (unsigned)oldx;
        const unsigned lefty = (unsigned)oldy;
        const unsigned rightx = (unsigned)(oldx + 1 >= w() ? oldx : oldx + 1);
        const unsigned righty = (unsigned)oldy;
        const unsigned dleftx = (unsigned)oldx;
        const unsigned dlefty = (unsigned)(oldy + 1 >= h() ? oldy : oldy + 1);
        const unsigned drightx = (unsigned)rightx;
        const unsigned drighty = (unsigned)dlefty;

        uchar left[4], right[4], downleft[4], downright[4];
        memcpy(left, array + lefty * line_d + leftx * d(), d());
        memcpy(right, array + righty * line_d + rightx * d(), d());
        memcpy(downleft, array + dlefty * line_d + dleftx * d(), d());
        memcpy(downright, array + drighty * line_d + drightx * d(), d());

        int i;
        if (d() == 4) {
          for (i = 0; i < 3; i++) {
            left[i] = (uchar)(left[i] * left[3] / 255.0f);
            right[i] = (uchar)(right[i] * right[3] / 255.0f);
            downleft[i] = (uchar)(downleft[i] * downleft[3] / 255.0f);
            downright[i] = (uchar)(downright[i] * downright[3] / 255.0f);
          }
        }

	const float leftf = 1 - xfract;
	const float rightf = xfract;
	const float upf = 1 - yfract;
	const float downf = yfract;

        for (i = 0; i < d(); i++) {
          new_ptr[i] = (uchar)((left[i] * leftf +
                   right[i] * rightf) * upf +
                   (downleft[i] * leftf +
                   downright[i] * rightf) * downf);
        }

        if (d() == 4 && new_ptr[3]) {
          for (i = 0; i < 3; i++) {
            new_ptr[i] = (uchar)(new_ptr[i] / (new_ptr[3] / 255.0f));
          }
        }
      }
    }
  }

  return new_image;
}